

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O0

void utest_arguments_parse_1(int *utest_result,size_t utest_index)

{
  size_t utest_index_local;
  int *utest_result_local;
  
  utest_run_arguments_parse_1(utest_result);
  return;
}

Assistant:

UTEST(arguments, parse_1) {
    Arguments arguments;

    const char* args[] = {
        "liveglsl",
        "shader.frag",
    };

    T(!ArgumentsParse(ARRAY_LENGTH(args), args, arguments));
}